

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O3

Nullable<ZXing::Pdf417::Codeword> *
ZXing::Pdf417::DetectCodeword
          (Nullable<ZXing::Pdf417::Codeword> *__return_storage_ptr__,BitMatrix *image,int minColumn,
          int maxColumn,bool leftToRight,int startColumn,int imageRow,int minCodewordWidth,
          int maxCodewordWidth)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Nullable<ZXing::Pdf417::Codeword> *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined3 in_register_00000081;
  uint uVar13;
  bool bVar14;
  int iVar15;
  ModuleBitCountType moduleBitCount;
  ModuleBitCountType result;
  undefined1 local_78 [20];
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar11 = CONCAT31(in_register_00000081,leftToRight);
  uVar13 = -uVar11 | 1;
  bVar14 = true;
  iVar15 = startColumn;
  uVar3 = uVar11;
LAB_00179d69:
  uVar10 = startColumn - iVar15;
  do {
    if ((uVar3 & 1) == 0) {
      if (maxColumn <= iVar15) break;
    }
    else if (iVar15 < minColumn) break;
    bVar1 = BitMatrix::get(image,iVar15,imageRow);
    if (((bVar1 ^ (byte)uVar3) & 1) != 0) break;
    uVar2 = -uVar10;
    if (0 < (int)uVar10) {
      uVar2 = uVar10;
    }
    iVar6 = startColumn;
    if (2 < uVar2) goto LAB_00179dcc;
    iVar15 = iVar15 + uVar13;
    uVar10 = uVar10 - uVar13;
  } while( true );
  uVar13 = -uVar13;
  uVar3 = uVar3 ^ 1;
  bVar1 = !bVar14;
  bVar14 = false;
  iVar6 = iVar15;
  if (bVar1) goto LAB_00179dcc;
  goto LAB_00179d69;
LAB_00179dcc:
  stack0xffffffffffffff98 = (undefined1  [16])0x0;
  local_78._0_16_ = (undefined1  [16])0x0;
  uVar9 = 0;
  iVar15 = iVar6;
LAB_00179df2:
  if (leftToRight) {
    if (maxColumn <= iVar15) goto LAB_00179e40;
  }
  else if (iVar15 < minColumn) goto LAB_00179e40;
  if (7 < uVar9) goto LAB_00179e40;
  bVar14 = BitMatrix::get(image,iVar15,imageRow);
  if (((bVar14 ^ (byte)uVar11) & 1) == 0) {
    *(int *)(local_78 + uVar9 * 4) = *(int *)(local_78 + uVar9 * 4) + 1;
    iVar15 = iVar15 + (leftToRight - 1 | 1);
  }
  else {
    uVar9 = uVar9 + 1;
    uVar11 = (uint)(byte)((byte)uVar11 ^ 1);
  }
  goto LAB_00179df2;
LAB_00179f68:
  __return_storage_ptr__->m_hasValue = true;
  (__return_storage_ptr__->m_value)._startX = iVar5;
  (__return_storage_ptr__->m_value)._endX = iVar12;
  (__return_storage_ptr__->m_value)._bucket =
       (((local_58._0_4_ + local_48._0_4_) - (local_58._8_4_ + local_48._8_4_)) + 9) % 9;
  (__return_storage_ptr__->m_value)._value = iVar15;
  goto LAB_00179f51;
LAB_00179e40:
  if (uVar9 == 8) {
LAB_00179e69:
    iVar15 = iStack_5c + local_78._12_4_ + iStack_64 + local_78._4_4_ +
             iStack_60 + local_78._8_4_ + local_78._16_4_ + local_78._0_4_;
    if (leftToRight) {
      iVar12 = iVar15 + iVar6;
      iVar5 = iVar6;
    }
    else {
      piVar7 = &iStack_5c;
      piVar8 = (int *)(local_78 + 4);
      do {
        iVar12 = piVar8[-1];
        piVar8[-1] = *piVar7;
        *piVar7 = iVar12;
        piVar7 = piVar7 + -1;
        bVar14 = piVar8 < piVar7;
        piVar8 = piVar8 + 1;
      } while (bVar14);
      iVar5 = iVar6 - iVar15;
      iVar12 = iVar6;
    }
    bVar14 = iVar15 <= maxCodewordWidth + 2;
    pNVar4 = (Nullable<ZXing::Pdf417::Codeword> *)(ulong)CONCAT31((int3)((uint)iVar15 >> 8),bVar14);
    if (minCodewordWidth + -2 <= iVar15 && bVar14) {
      uVar3 = CodewordDecoder::GetDecodedValue((array<int,_8UL> *)local_78);
      pNVar4 = (Nullable<ZXing::Pdf417::Codeword> *)CONCAT44(extraout_var,uVar3);
      if (uVar3 != 0xffffffff) {
        iVar15 = CodewordDecoder::GetCodeword(uVar3);
        pNVar4 = (Nullable<ZXing::Pdf417::Codeword> *)CONCAT44(extraout_var_00,iVar15);
        if (iVar15 != -1) {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          iVar6 = 7;
          uVar11 = 0;
          do {
            if ((uVar3 & 1) != uVar11) {
              if (iVar6 < 1) goto LAB_00179f68;
              iVar6 = iVar6 + -1;
              uVar11 = uVar3 & 1;
            }
            *(int *)(local_58 + (long)iVar6 * 4) = *(int *)(local_58 + (long)iVar6 * 4) + 1;
            uVar3 = (int)uVar3 >> 1;
          } while( true );
        }
      }
    }
  }
  else {
    if (leftToRight) {
      minColumn = maxColumn;
    }
    pNVar4 = (Nullable<ZXing::Pdf417::Codeword> *)
             (ulong)CONCAT31((int3)((uint)minColumn >> 8),minColumn == iVar15);
    if (minColumn == iVar15 && uVar9 == 7) goto LAB_00179e69;
  }
  __return_storage_ptr__->m_hasValue = false;
  (__return_storage_ptr__->m_value)._startX = 0;
  (__return_storage_ptr__->m_value)._endX = 0;
  (__return_storage_ptr__->m_value)._bucket = 0;
  (__return_storage_ptr__->m_value)._value = 0;
LAB_00179f51:
  (__return_storage_ptr__->m_value)._rowNumber = -1;
  return pNVar4;
}

Assistant:

static Nullable<Codeword> DetectCodeword(const BitMatrix& image, int minColumn, int maxColumn, bool leftToRight, int startColumn, int imageRow, int minCodewordWidth, int maxCodewordWidth)
{
	startColumn = AdjustCodewordStartColumn(image, minColumn, maxColumn, leftToRight, startColumn, imageRow);
	// we usually know fairly exact now how long a codeword is. We should provide minimum and maximum expected length
	// and try to adjust the read pixels, e.g. remove single pixel errors or try to cut off exceeding pixels.
	// min and maxCodewordWidth should not be used as they are calculated for the whole barcode an can be inaccurate
	// for the current position
	ModuleBitCountType moduleBitCount;
	if (!GetModuleBitCount(image, minColumn, maxColumn, leftToRight, startColumn, imageRow, moduleBitCount)) {
		return nullptr;
	}
	int endColumn;
	int codewordBitCount = Reduce(moduleBitCount);
	if (leftToRight) {
		endColumn = startColumn + codewordBitCount;
	}
	else {
		std::reverse(moduleBitCount.begin(), moduleBitCount.end());
		endColumn = startColumn;
		startColumn = endColumn - codewordBitCount;
	}
	// TODO implement check for width and correction of black and white bars
	// use start (and maybe stop pattern) to determine if blackbars are wider than white bars. If so, adjust.
	// should probably done only for codewords with a lot more than 17 bits. 
	// The following fixes 10-1.png, which has wide black bars and small white bars
	//    for (int i = 0; i < moduleBitCount.length; i++) {
	//      if (i % 2 == 0) {
	//        moduleBitCount[i]--;
	//      } else {
	//        moduleBitCount[i]++;
	//      }
	//    }

	// We could also use the width of surrounding codewords for more accurate results, but this seems
	// sufficient for now
	if (!CheckCodewordSkew(codewordBitCount, minCodewordWidth, maxCodewordWidth)) {
		// We could try to use the startX and endX position of the codeword in the same column in the previous row,
		// create the bit count from it and normalize it to 8. This would help with single pixel errors.
		return nullptr;
	}

	int decodedValue = CodewordDecoder::GetDecodedValue(moduleBitCount);
	if (decodedValue != -1) {
		int codeword = CodewordDecoder::GetCodeword(decodedValue);
		if (codeword != -1) {
			return Codeword(startColumn, endColumn, GetCodewordBucketNumber(decodedValue), codeword);
		}
	}
	return nullptr;
}